

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-path.c
# Opt level: O0

_Bool see_wall(wchar_t dir,loc grid)

{
  _Bool _Var1;
  loc_conflict grid_00;
  wchar_t dir_local;
  loc grid_local;
  
  grid_00 = (loc_conflict)loc_sum(grid,ddgrid[dir]);
  _Var1 = square_in_bounds((chunk *)cave,grid_00);
  if (_Var1) {
    _Var1 = square_iswebbed((chunk *)cave,grid_00);
    if (_Var1) {
      grid_local.x._3_1_ = true;
    }
    else {
      _Var1 = square_seemslikewall((chunk *)cave,grid_00);
      if (_Var1) {
        _Var1 = square_isknown((chunk *)cave,grid_00);
        if (_Var1) {
          grid_local.x._3_1_ = true;
        }
        else {
          grid_local.x._3_1_ = false;
        }
      }
      else {
        grid_local.x._3_1_ = false;
      }
    }
  }
  else {
    grid_local.x._3_1_ = false;
  }
  return grid_local.x._3_1_;
}

Assistant:

static bool see_wall(int dir, struct loc grid)
{
	/* Get the new location */
	grid = loc_sum(grid, ddgrid[dir]);

	/* Illegal grids are not known walls XXX XXX XXX */
	if (!square_in_bounds(cave, grid)) return false;

	/* Webs are enough like walls */
	if (square_iswebbed(cave, grid)) return true;

	/* Non-wall grids are not known walls */
	if (!square_seemslikewall(cave, grid)) return false;

	/* Unknown walls are not known walls */
	if (!square_isknown(cave, grid)) return false;

	/* Default */
	return true;
}